

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

String * capnp::compiler::expressionString(Reader name)

{
  Reader exp;
  undefined1 auVar1 [40];
  String *in_RDI;
  undefined8 in_stack_ffffffffffffff58;
  StringTree local_48;
  
  auVar1 = name._reader._0_40_;
  exp._reader._40_8_ = in_stack_ffffffffffffff58;
  exp._reader.segment = (SegmentReader *)auVar1._0_8_;
  exp._reader.capTable = (CapTableReader *)auVar1._8_8_;
  exp._reader.data = (void *)auVar1._16_8_;
  exp._reader.pointers = (WirePointer *)auVar1._24_8_;
  exp._reader.dataSize = auVar1._32_4_;
  exp._reader.pointerCount = auVar1._36_2_;
  exp._reader._38_2_ = auVar1._38_2_;
  expressionStringTree(exp);
  kj::StringTree::flatten(in_RDI,&local_48);
  kj::StringTree::~StringTree(&local_48);
  return in_RDI;
}

Assistant:

kj::String expressionString(Expression::Reader name) {
  return expressionStringTree(name).flatten();
}